

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.cpp
# Opt level: O2

void __thiscall
helics::PublicationInfo::removeSubscriber(PublicationInfo *this,GlobalHandle subscriberToRemove)

{
  SubscriberInformation *pSVar1;
  long lVar2;
  long lVar3;
  InterfaceHandle IVar4;
  SubscriberInformation *pSVar5;
  const_iterator __first;
  SubscriberInformation *pSVar6;
  GlobalFederateId GVar7;
  const_iterator __last;
  
  pSVar5 = (this->subscribers).
           super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->subscribers).
       super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)__last._M_current - (long)pSVar5;
  lVar2 = lVar3 / 0x28 >> 2;
  while( true ) {
    GVar7 = subscriberToRemove.fed_id.gid;
    IVar4 = subscriberToRemove.handle.hid;
    if (lVar2 < 1) break;
    if (((pSVar5->id).fed_id.gid == GVar7.gid) &&
       (__first._M_current = pSVar5, (pSVar5->id).handle.hid == IVar4.hid)) goto LAB_002a97b2;
    if ((pSVar5[1].id.fed_id.gid == GVar7.gid) && (pSVar5[1].id.handle.hid == IVar4.hid)) {
      __first._M_current = pSVar5 + 1;
      goto LAB_002a97b2;
    }
    if ((pSVar5[2].id.fed_id.gid == GVar7.gid) && (pSVar5[2].id.handle.hid == IVar4.hid)) {
      __first._M_current = pSVar5 + 2;
      goto LAB_002a97b2;
    }
    if ((pSVar5[3].id.fed_id.gid == GVar7.gid) && (pSVar5[3].id.handle.hid == IVar4.hid)) {
      __first._M_current = pSVar5 + 3;
      goto LAB_002a97b2;
    }
    pSVar5 = pSVar5 + 4;
    lVar2 = lVar2 + -1;
    lVar3 = lVar3 + -0xa0;
  }
  lVar3 = lVar3 / 0x28;
  if (lVar3 == 1) {
LAB_002a9790:
    __first._M_current = pSVar5;
    if ((pSVar5->id).handle.hid != IVar4.hid || (pSVar5->id).fed_id.gid != GVar7.gid) {
      __first._M_current = __last._M_current;
    }
  }
  else if (lVar3 == 2) {
LAB_002a9782:
    if (((pSVar5->id).fed_id.gid != GVar7.gid) ||
       (__first._M_current = pSVar5, (pSVar5->id).handle.hid != IVar4.hid)) {
      pSVar5 = pSVar5 + 1;
      goto LAB_002a9790;
    }
  }
  else {
    __first._M_current = __last._M_current;
    if (lVar3 != 3) goto LAB_002a97fd;
    if (((pSVar5->id).fed_id.gid != GVar7.gid) ||
       (__first._M_current = pSVar5, (pSVar5->id).handle.hid != IVar4.hid)) {
      pSVar5 = pSVar5 + 1;
      goto LAB_002a9782;
    }
  }
LAB_002a97b2:
  pSVar5 = __first._M_current;
  if (__first._M_current != __last._M_current) {
    while (pSVar6 = __first._M_current + 1, pSVar6 != __last._M_current) {
      if (((pSVar6->id).fed_id.gid != GVar7.gid) ||
         (pSVar1 = __first._M_current + 1, __first._M_current = pSVar6,
         (pSVar1->id).handle.hid != IVar4.hid)) {
        SubscriberInformation::operator=(pSVar5,pSVar6);
        __first._M_current = pSVar6;
        pSVar5 = pSVar5 + 1;
      }
    }
    __last._M_current =
         (this->subscribers).
         super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    __first._M_current = pSVar5;
  }
LAB_002a97fd:
  std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::erase
            (&this->subscribers,__first,__last);
  return;
}

Assistant:

void PublicationInfo::removeSubscriber(GlobalHandle subscriberToRemove)
{
    subscribers.erase(std::remove_if(subscribers.begin(),
                                     subscribers.end(),
                                     [subscriberToRemove](const auto& val) {
                                         return val.id == subscriberToRemove;
                                     }),
                      subscribers.end());
}